

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTest.cpp
# Opt level: O1

void __thiscall
oout::NamedTest::NamedTest
          (NamedTest *this,string *name,
          list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
          *tests)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined1 local_41;
  SuiteTest *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  shared_ptr<const_oout::Test> local_30;
  
  local_40 = (SuiteTest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::SuiteTest_const,std::allocator<oout::SuiteTest>,std::__cxx11::list<std::shared_ptr<oout::Test_const>,std::allocator<std::shared_ptr<oout::Test_const>>>const&>
            (&_Stack_38,&local_40,(allocator<oout::SuiteTest> *)&local_41,tests);
  this_00._M_pi = _Stack_38._M_pi;
  local_30.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_40->super_Test;
  local_30.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_38._M_pi;
  local_40 = (SuiteTest *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  NamedTest(this,name,&local_30);
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
  }
  return;
}

Assistant:

NamedTest::NamedTest(const string &name, const list<shared_ptr<const Test>> &tests)
	: NamedTest(name, make_shared<const SuiteTest>(tests))
{
}